

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_str_match_here(char *regexp,char *text)

{
  char *text_local;
  char *regexp_local;
  
  if (*regexp == '\0') {
    regexp_local._4_4_ = 1;
  }
  else if (regexp[1] == '*') {
    regexp_local._4_4_ = nk_str_match_star((int)*regexp,regexp + 2,text);
  }
  else if ((*regexp == '$') && (regexp[1] == '\0')) {
    regexp_local._4_4_ = (uint)(*text == '\0');
  }
  else if ((*text == '\0') || ((*regexp != '.' && (*regexp != *text)))) {
    regexp_local._4_4_ = 0;
  }
  else {
    regexp_local._4_4_ = nk_str_match_here(regexp + 1,text + 1);
  }
  return regexp_local._4_4_;
}

Assistant:

NK_INTERN int
nk_str_match_here(const char *regexp, const char *text)
{
    if (regexp[0] == '\0')
        return 1;
    if (regexp[1] == '*')
        return nk_str_match_star(regexp[0], regexp+2, text);
    if (regexp[0] == '$' && regexp[1] == '\0')
        return *text == '\0';
    if (*text!='\0' && (regexp[0]=='.' || regexp[0]==*text))
        return nk_str_match_here(regexp+1, text+1);
    return 0;
}